

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O2

bool __thiscall
acto::actor_ref::send<msg_out,std::__cxx11::string>
          (actor_ref *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p)

{
  bool bVar1;
  _Head_base<0UL,_acto::core::msg_t_*,_false> local_20;
  _Alloc_hider local_18;
  
  if (this->object_ == (object_t *)0x0) {
    bVar1 = false;
  }
  else {
    std::make_unique<acto::core::msg_wrap_t<msg_out>,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffe8);
    local_20._M_head_impl = (msg_t *)local_18._M_p;
    local_18._M_p = (pointer)0x0;
    bVar1 = send_message(this,(unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>
                               *)&local_20);
    if (local_20._M_head_impl != (msg_t *)0x0) {
      (*(local_20._M_head_impl)->_vptr_msg_t[1])();
    }
    local_20._M_head_impl = (msg_t *)0x0;
    if ((long *)local_18._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_18._M_p + 8))();
    }
  }
  return bVar1;
}

Assistant:

inline bool send(P&&... p) const {
    if (!object_) {
      return false;
    }

    return send_message(
      std::make_unique<core::msg_wrap_t<std::remove_cvref_t<Msg>>>(
        std::forward<P>(p)...));
  }